

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  unsigned_long uVar7;
  void **ppvVar8;
  size_t *in_RCX;
  void **in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  int i;
  int length;
  int lzss_offset;
  int code;
  int sym;
  int ret;
  size_t bs;
  int64_t actualend;
  int64_t end;
  int64_t start;
  rar *rar;
  IPpmd7_RangeDec *in_stack_000008f0;
  CPpmd7 *in_stack_000008f8;
  uint8_t in_stack_ffffffffffffff8f;
  rar *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int iVar9;
  archive_read *in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc8;
  rar *rar_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar9 = 0;
  rar_00 = *(rar **)in_RDI[0x15].archive_format_name;
  do {
    if (rar_00->valid == '\0') {
      return -0x1e;
    }
    if ((rar_00->ppmd_eod != '\0') ||
       ((rar_00->dictionary_size != 0 && (rar_00->unp_size <= rar_00->offset)))) {
      if (rar_00->unp_offset != 0) {
        *(uchar **)&in_RSI->archive = rar_00->unp_buffer;
        *in_RDX = (void *)(ulong)rar_00->unp_offset;
        *in_RCX = rar_00->offset_outgoing;
        rar_00->offset_outgoing = (long)*in_RDX + rar_00->offset_outgoing;
        uVar1._0_4_ = (in_RSI->archive).magic;
        uVar1._4_4_ = (in_RSI->archive).state;
        uVar7 = crc32(rar_00->crc_calculated,uVar1,(ulong)*in_RDX & 0xffffffff);
        rar_00->crc_calculated = uVar7;
        rar_00->unp_offset = 0;
        return 0;
      }
      (in_RSI->archive).magic = 0;
      (in_RSI->archive).state = 0;
      *in_RDX = (void *)0x0;
      *in_RCX = rar_00->offset;
      if (rar_00->file_crc != rar_00->crc_calculated) {
        archive_set_error(in_RDI,0x54,"File CRC error");
        return -0x1e;
      }
      rar_00->entry_eof = '\x01';
      return 1;
    }
    if (((rar_00->is_ppmd_block == '\0') && (rar_00->dictionary_size != 0)) &&
       (0 < rar_00->bytes_uncopied)) {
      if ((long)(ulong)(rar_00->unp_buffer_size - rar_00->unp_offset) < rar_00->bytes_uncopied) {
        ppvVar8 = (void **)(ulong)(rar_00->unp_buffer_size - rar_00->unp_offset);
      }
      else {
        ppvVar8 = (void **)rar_00->bytes_uncopied;
      }
      iVar6 = copy_from_lzss_window
                        (in_stack_ffffffffffffffb8,ppvVar8,CONCAT44(iVar9,in_stack_ffffffffffffffa8)
                         ,in_stack_ffffffffffffffa4);
      if (iVar6 != 0) {
        return iVar6;
      }
      rar_00->offset = (long)ppvVar8 + rar_00->offset;
      rar_00->bytes_uncopied = rar_00->bytes_uncopied - (long)ppvVar8;
      lVar2._0_4_ = (in_RSI->archive).magic;
      lVar2._4_4_ = (in_RSI->archive).state;
      iVar9 = 0;
      if (lVar2 != 0) {
        rar_00->unp_offset = 0;
        *in_RDX = (void *)(ulong)rar_00->unp_buffer_size;
        *in_RCX = rar_00->offset_outgoing;
        rar_00->offset_outgoing = (long)*in_RDX + rar_00->offset_outgoing;
        uVar3._0_4_ = (in_RSI->archive).magic;
        uVar3._4_4_ = (in_RSI->archive).state;
        uVar7 = crc32(rar_00->crc_calculated,uVar3,(ulong)*in_RDX & 0xffffffff);
        rar_00->crc_calculated = uVar7;
        return iVar6;
      }
    }
    else {
      if (((rar_00->br).next_in == (uchar *)0x0) &&
         (iVar9 = rar_br_preparation((archive_read *)
                                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                     (rar_br *)in_stack_ffffffffffffff90), iVar9 < -0x14)) {
        return iVar9;
      }
      if ((rar_00->start_new_table != '\0') &&
         (iVar9 = parse_codes((archive_read *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
         iVar9 < -0x14)) {
        return iVar9;
      }
      if (rar_00->is_ppmd_block == '\0') {
        in_stack_ffffffffffffffc8 = (archive_read *)rar_00->offset;
        rar_00->filterstart = 0x7fffffffffffffff;
        in_stack_ffffffffffffffb8 =
             (archive_read *)
             expand(in_stack_ffffffffffffffc8,
                    (long)&(in_stack_ffffffffffffffc8->archive).magic +
                    (ulong)rar_00->dictionary_size);
        if ((long)in_stack_ffffffffffffffb8 < 0) {
          return (int)in_stack_ffffffffffffffb8;
        }
        rar_00->bytes_uncopied = (long)in_stack_ffffffffffffffb8 - (long)in_stack_ffffffffffffffc8;
        if (rar_00->bytes_uncopied == 0) {
          archive_set_error(in_RDI,0x54,"Internal error extracting RAR file");
          return -0x1e;
        }
      }
      else {
        in_stack_ffffffffffffffa8 = Ppmd7_DecodeSymbol(in_stack_000008f8,in_stack_000008f0);
        if (in_stack_ffffffffffffffa8 < 0) {
          archive_set_error(in_RDI,0x54,"Invalid symbol");
          return -0x1e;
        }
        if (in_stack_ffffffffffffffa8 == rar_00->ppmd_escape) {
          in_stack_ffffffffffffffa4 = Ppmd7_DecodeSymbol(in_stack_000008f8,in_stack_000008f0);
          if ((int)in_stack_ffffffffffffffa4 < 0) {
            archive_set_error(in_RDI,0x54,"Invalid symbol");
            return -0x1e;
          }
          in_stack_ffffffffffffff90 = (rar *)(ulong)in_stack_ffffffffffffffa4;
          switch(in_stack_ffffffffffffff90) {
          case (rar *)0x0:
            rar_00->start_new_table = '\x01';
            iVar9 = read_data_compressed(in_RSI,in_RDX,in_RCX,(int64_t *)rar_00);
            return iVar9;
          default:
            lzss_emit_literal(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
            rar_00->bytes_uncopied = rar_00->bytes_uncopied + 1;
            break;
          case (rar *)0x2:
            rar_00->ppmd_eod = '\x01';
            goto LAB_0014a210;
          case (rar *)0x3:
            archive_set_error(in_RDI,-1,"Parsing filters is unsupported.");
            return -0x19;
          case (rar *)0x4:
            for (in_stack_ffffffffffffff98 = 2; -1 < in_stack_ffffffffffffff98;
                in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + -1) {
              in_stack_ffffffffffffffa4 = Ppmd7_DecodeSymbol(in_stack_000008f8,in_stack_000008f0);
              if ((int)in_stack_ffffffffffffffa4 < 0) {
                archive_set_error(in_RDI,0x54,"Invalid symbol");
                return -0x1e;
              }
            }
            in_stack_ffffffffffffff9c = Ppmd7_DecodeSymbol(in_stack_000008f8,in_stack_000008f0);
            if (in_stack_ffffffffffffff9c < 0) {
              archive_set_error(in_RDI,0x54,"Invalid symbol");
              return -0x1e;
            }
            lzss_emit_match(rar_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                            (int)in_stack_ffffffffffffffc8);
            rar_00->bytes_uncopied =
                 (long)(in_stack_ffffffffffffff9c + 0x20) + rar_00->bytes_uncopied;
            break;
          case (rar *)0x5:
            in_stack_ffffffffffffff9c = Ppmd7_DecodeSymbol(in_stack_000008f8,in_stack_000008f0);
            if (in_stack_ffffffffffffff9c < 0) {
              archive_set_error(in_RDI,0x54,"Invalid symbol");
              return -0x1e;
            }
            lzss_emit_match(rar_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                            (int)in_stack_ffffffffffffffc8);
            rar_00->bytes_uncopied = (long)(in_stack_ffffffffffffff9c + 4) + rar_00->bytes_uncopied;
          }
        }
        else {
          lzss_emit_literal(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
          rar_00->bytes_uncopied = rar_00->bytes_uncopied + 1;
        }
      }
      if ((long)(ulong)(rar_00->unp_buffer_size - rar_00->unp_offset) < rar_00->bytes_uncopied) {
        ppvVar8 = (void **)(ulong)(rar_00->unp_buffer_size - rar_00->unp_offset);
      }
      else {
        ppvVar8 = (void **)rar_00->bytes_uncopied;
      }
      iVar9 = copy_from_lzss_window
                        (in_stack_ffffffffffffffb8,ppvVar8,CONCAT44(iVar9,in_stack_ffffffffffffffa8)
                         ,in_stack_ffffffffffffffa4);
      if (iVar9 != 0) {
        return iVar9;
      }
      rar_00->offset = (long)ppvVar8 + rar_00->offset;
      rar_00->bytes_uncopied = rar_00->bytes_uncopied - (long)ppvVar8;
      iVar9 = 0;
    }
LAB_0014a210:
    lVar4._0_4_ = (in_RSI->archive).magic;
    lVar4._4_4_ = (in_RSI->archive).state;
    if (lVar4 != 0) {
      rar_00->unp_offset = 0;
      *in_RDX = (void *)(ulong)rar_00->unp_buffer_size;
      *in_RCX = rar_00->offset_outgoing;
      rar_00->offset_outgoing = (long)*in_RDX + rar_00->offset_outgoing;
      uVar5._0_4_ = (in_RSI->archive).magic;
      uVar5._4_4_ = (in_RSI->archive).state;
      uVar7 = crc32(rar_00->crc_calculated,uVar5,(ulong)*in_RDX & 0xffffffff);
      rar_00->crc_calculated = uVar7;
      return iVar9;
    }
  } while( true );
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
               int64_t *offset)
{
  struct rar *rar;
  int64_t start, end, actualend;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);
    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;
      rar->filterstart = INT64_MAX;

      if ((actualend = expand(a, end)) < 0)
        return ((int)actualend);

      rar->bytes_uncopied = actualend - start;
      if (rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}